

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O1

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,BottomLevelASDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceVkImpl *pRVar1;
  
  DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_009337e0;
  this->m_State = RESOURCE_STATE_UNKNOWN;
  (this->m_NameToIndex)._M_h._M_buckets = &(this->m_NameToIndex)._M_h._M_single_bucket;
  (this->m_NameToIndex)._M_h._M_bucket_count = 1;
  (this->m_NameToIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_NameToIndex)._M_h._M_element_count = 0;
  (this->m_NameToIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_NameToIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_NameToIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->m_NameToIndex)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)((long)&this->m_pRawPtr + 4) = 0;
  (this->m_ScratchSize).Build = 0;
  (this->m_ScratchSize).Update = 0;
  (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i = 0;
  pRVar1 = DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      );
  if ((pRVar1->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing ==
      DEVICE_FEATURE_STATE_DISABLED) {
    LogError<true,char[44]>
              (false,"BottomLevelASBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x61,(char (*) [44])"Ray tracing is not supported by this device");
  }
  ValidateBottomLevelASDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
              ).m_Desc);
  if (Desc->CompactedSize == 0) {
    CopyGeometryDescriptionUnsafe(this,Desc,(BLASNameToIndex *)0x0);
  }
  return;
}

Assistant:

BottomLevelASBase(IReferenceCounters*      pRefCounters,
                      RenderDeviceImplType*    pDevice,
                      const BottomLevelASDesc& Desc,
                      bool                     bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        if (!this->GetDevice()->GetFeatures().RayTracing)
            LOG_ERROR_AND_THROW("Ray tracing is not supported by this device");

        ValidateBottomLevelASDesc(this->m_Desc);

        if (Desc.CompactedSize > 0)
        {
        }
        else
        {
            CopyGeometryDescriptionUnsafe(Desc, nullptr);
        }
    }